

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void __thiscall Assimp::BaseImporter::~BaseImporter(BaseImporter *this)

{
  BaseImporter *this_local;
  
  this->_vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00f3e9d0;
  std::__cxx11::string::~string((string *)&this->m_ErrorText);
  std::
  map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
  ::~map(&this->importerUnits);
  return;
}

Assistant:

BaseImporter::~BaseImporter() {
    // nothing to do here
}